

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::get_3(disp *this,int x,int y,int z)

{
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ts<int>(&local_60,x);
  std::operator+(&local_a0,"get_3",&local_60);
  ts<int>(&local_c0,y);
  std::operator+(&local_80,&local_a0,&local_c0);
  ts<int>(&local_e0,z);
  std::operator+(&local_40,&local_80,&local_e0);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void get_3(int x,int y,int z) { v_="get_3" + ts(x)+ts(y)+ts(z); }